

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_test.cc
# Opt level: O1

void __thiscall anon_unknown.dwarf_4ebe96::BNTest_MPI_Test::TestBody(BNTest_MPI_Test *this)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  BIGNUM *actual;
  long lVar2;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  char *pcVar3;
  pointer message;
  BIGNUM *in_R9;
  bool bVar4;
  ScopedTrace gtest_trace_1269;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  UniquePtr<BIGNUM> bn;
  UniquePtr<BIGNUM> bn2;
  size_t mpi_len;
  size_t mpi_len2;
  uint8_t scratch [8];
  ScopedTrace local_a1;
  undefined1 local_a0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_98;
  undefined1 local_90 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  unique_ptr<bignum_st,_bssl::internal::Deleter> local_70;
  Bytes local_68;
  AssertHelper local_58;
  AssertHelper local_50;
  AssertHelper local_48;
  unsigned_long local_40;
  uchar local_38 [8];
  
  lVar2 = 0;
  while( true ) {
    pcVar3 = *(char **)((long)&(anonymous_namespace)::kMPITests + lVar2);
    testing::ScopedTrace::ScopedTrace
              (&local_a1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
               ,0x4f5,pcVar3);
    local_90 = (undefined1  [8])0x0;
    iVar1 = BN_asc2bn((BIGNUM **)local_90,pcVar3);
    local_70._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl =
         (__uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true>)
         (__uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true>)local_90;
    if (iVar1 == 0) {
      local_70._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl =
           (__uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true>)
           (__uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true>)
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
    }
    local_a0[0] = (tuple<bignum_st_*,_bssl::internal::Deleter>)
                  local_70._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                  super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl !=
                  (_Head_base<0UL,_bignum_st_*,_false>)0x0;
    pbStack_98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((tuple<bignum_st_*,_bssl::internal::Deleter>)
        local_70._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl ==
        (_Head_base<0UL,_bignum_st_*,_false>)0x0) break;
    iVar1 = BN_bn2mpi((BIGNUM *)
                      local_70._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                      super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,(uchar *)0x0);
    local_58.data_ = (AssertHelperData *)CONCAT44(extraout_var,iVar1);
    local_a0 = (undefined1  [8])0x8;
    testing::internal::CmpHelperLE<unsigned_long,unsigned_long>
              ((internal *)local_90,"mpi_len","sizeof(scratch)",(unsigned_long *)&local_58,
               (unsigned_long *)local_a0);
    if (local_90[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_a0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)((long)local_a0 + 0x10),"MPI size is too large to test",0x1d);
      if (local_88 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message = "";
      }
      else {
        message = (local_88->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_68,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                 ,0x4fa,message);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_68,(Message *)local_a0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_68);
      if (local_a0 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_a0 + 8))();
      }
      if (local_88 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      goto LAB_002bd824;
      this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_88;
      goto LAB_002bd81f;
    }
    if (local_88 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_88,local_88);
    }
    iVar1 = BN_bn2mpi((BIGNUM *)
                      local_70._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                      super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,local_38);
    local_40 = CONCAT44(extraout_var_00,iVar1);
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)local_90,"mpi_len","mpi_len2",(unsigned_long *)&local_58,&local_40);
    if (local_90[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_a0);
      pcVar3 = "";
      if (local_88 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = (local_88->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_68,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                 ,0x4fd,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_68,(Message *)local_a0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_68);
      if (local_a0 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_a0 + 8))();
      }
    }
    if (local_88 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_88,local_88);
    }
    local_a0 = *(undefined1 (*) [8])
                &((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                   *)((long)&PTR_anon_var_dwarf_51ebed_006fc298 + lVar2))->
                 super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ;
    pbStack_98 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                  (&UNK_006fc2a0 + lVar2);
    local_68.span_.size_ = (size_t)local_58.data_;
    local_68.span_.data_ = local_38;
    testing::internal::CmpHelperEQ<Bytes,Bytes>
              ((internal *)local_90,"Bytes(test.mpi, test.mpi_len)","Bytes(scratch, mpi_len)",
               (Bytes *)local_a0,&local_68);
    if (local_90[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_a0);
      pcVar3 = "";
      if (local_88 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = (local_88->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_68,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                 ,0x4fe,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_68,(Message *)local_a0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_68);
      if (local_a0 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_a0 + 8))();
      }
    }
    if (local_88 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_88,local_88);
    }
    actual = BN_mpi2bn(local_38,(int)local_58.data_,(BIGNUM *)0x0);
    local_a0[0] = actual != (BIGNUM *)0x0;
    pbStack_98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_68.span_.data_ = (uchar *)actual;
    if (actual == (BIGNUM *)0x0) {
      testing::Message::Message((Message *)&local_50);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&(local_50.data_)->line,"failed to parse",0xf);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_90,(internal *)local_a0,(AssertionResult *)"bn2","false","true",
                 (char *)in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_48,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                 ,0x501,(char *)local_90);
      testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
      testing::internal::AssertHelper::~AssertHelper(&local_48);
      if (local_90 != (undefined1  [8])&local_80) {
        operator_delete((void *)local_90,local_80._M_allocated_capacity + 1);
      }
      if (local_50.data_ != (AssertHelperData *)0x0) {
        (**(code **)(*(long *)local_50.data_ + 8))();
      }
      if (pbStack_98 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&pbStack_98,pbStack_98);
      }
      std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&local_68);
      goto LAB_002bd824;
    }
    in_R9 = actual;
    AssertBIGNUMSEqual((char *)local_90,"bn.get()","bn2.get()","BN_mpi2bn",
                       (BIGNUM *)
                       local_70._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,(BIGNUM *)actual);
    if (local_90[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_a0);
      pcVar3 = "";
      if (local_88 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = (local_88->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                 ,0x502,pcVar3);
      testing::internal::AssertHelper::operator=(&local_50,(Message *)local_a0);
      testing::internal::AssertHelper::~AssertHelper(&local_50);
      if (local_a0 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_a0 + 8))();
      }
    }
    if (local_88 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_88,local_88);
    }
    std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&local_68);
    std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr(&local_70);
    testing::ScopedTrace::~ScopedTrace(&local_a1);
    if (actual == (BIGNUM *)0x0) {
      return;
    }
    bVar4 = lVar2 == 0x78;
    lVar2 = lVar2 + 0x18;
    if (bVar4) {
      return;
    }
  }
  testing::Message::Message((Message *)&local_68);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            ((string *)local_90,(internal *)local_a0,(AssertionResult *)0x55e5dc,"false","true",
             (char *)in_R9);
  testing::internal::AssertHelper::AssertHelper
            (&local_58,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
             ,0x4f7,(char *)local_90);
  testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_68);
  testing::internal::AssertHelper::~AssertHelper(&local_58);
  if (local_90 != (undefined1  [8])&local_80) {
    operator_delete((void *)local_90,local_80._M_allocated_capacity + 1);
  }
  if ((BIGNUM *)local_68.span_.data_ != (BIGNUM *)0x0) {
    (*(code *)(*(ulong **)local_68.span_.data_)[1])();
  }
  if (pbStack_98 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  goto LAB_002bd824;
  this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&pbStack_98;
  local_88 = pbStack_98;
LAB_002bd81f:
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(this_00,local_88);
LAB_002bd824:
  std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr(&local_70);
  testing::ScopedTrace::~ScopedTrace(&local_a1);
  return;
}

Assistant:

TEST_F(BNTest, MPI) {
  uint8_t scratch[8];

  for (const auto &test : kMPITests) {
    SCOPED_TRACE(test.base10);
    bssl::UniquePtr<BIGNUM> bn(ASCIIToBIGNUM(test.base10));
    ASSERT_TRUE(bn);

    const size_t mpi_len = BN_bn2mpi(bn.get(), NULL);
    ASSERT_LE(mpi_len, sizeof(scratch)) << "MPI size is too large to test";

    const size_t mpi_len2 = BN_bn2mpi(bn.get(), scratch);
    EXPECT_EQ(mpi_len, mpi_len2);
    EXPECT_EQ(Bytes(test.mpi, test.mpi_len), Bytes(scratch, mpi_len));

    bssl::UniquePtr<BIGNUM> bn2(BN_mpi2bn(scratch, mpi_len, NULL));
    ASSERT_TRUE(bn2) << "failed to parse";
    EXPECT_BIGNUMS_EQUAL("BN_mpi2bn", bn.get(), bn2.get());
  }
}